

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_fixture.c
# Opt level: O1

void kbd_callback(char *name,int name_len,char *instruct,int instruct_len,int num_prompts,
                 LIBSSH2_USERAUTH_KBDINT_PROMPT *prompts,LIBSSH2_USERAUTH_KBDINT_RESPONSE *responses
                 ,void **abstract)

{
  char *__s;
  char *pcVar1;
  size_t sVar2;
  ulong uVar3;
  size_t *psVar4;
  
  fprintf(_stdout,"Kb-int name: %.*s\n",name_len,name);
  fprintf(_stdout,"Kb-int instruction: %.*s\n",(ulong)(uint)instruct_len,instruct);
  if (0 < num_prompts) {
    psVar4 = &prompts->length;
    uVar3 = 0;
    do {
      fprintf(_stdout,"Kb-int prompt %d: %.*s\n",uVar3 & 0xffffffff,(ulong)(uint)*psVar4,
              ((LIBSSH2_USERAUTH_KBDINT_PROMPT *)(psVar4 + -1))->text);
      uVar3 = uVar3 + 1;
      psVar4 = psVar4 + 3;
    } while ((uint)num_prompts != uVar3);
  }
  __s = kbd_password;
  if (num_prompts == 1) {
    pcVar1 = strdup(kbd_password);
    responses->text = pcVar1;
    sVar2 = strlen(__s);
    responses->length = (uint)sVar2;
  }
  return;
}

Assistant:

static void kbd_callback(const char *name, int name_len,
                         const char *instruct, int instruct_len,
                         int num_prompts,
                         const LIBSSH2_USERAUTH_KBDINT_PROMPT *prompts,
                         LIBSSH2_USERAUTH_KBDINT_RESPONSE *responses,
                         void **abstract)
{
    int i;
    (void)abstract;

    fprintf(stdout, "Kb-int name: %.*s\n", name_len, name);
    fprintf(stdout, "Kb-int instruction: %.*s\n", instruct_len, instruct);
    for(i = 0; i < num_prompts; ++i) {
        fprintf(stdout, "Kb-int prompt %d: %.*s\n", i,
                (int)prompts[i].length, prompts[i].text);
    }

    if(num_prompts == 1) {
        responses[0].text = strdup(kbd_password);
        responses[0].length = (unsigned int)strlen(kbd_password);
    }
}